

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O3

void __thiscall
libcellml::GeneratorProfile::setImplementationComputeVariablesMethodString
          (GeneratorProfile *this,bool forDifferentialModel,bool withExternalVariables,
          string *implementationComputeVariablesMethodString)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)&(this->mPimpl->mImplementationComputeVariablesMethodFamWoevString)._M_dataplus.
                     _M_p +
             (ulong)(uint)((int)CONCAT71(in_register_00000031,forDifferentialModel) << 7 |
                          (int)CONCAT71(in_register_00000011,withExternalVariables) << 6)));
  return;
}

Assistant:

void GeneratorProfile::setImplementationComputeVariablesMethodString(bool forDifferentialModel,
                                                                     bool withExternalVariables,
                                                                     const std::string &implementationComputeVariablesMethodString)
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            mPimpl->mImplementationComputeVariablesMethodFdmWevString = implementationComputeVariablesMethodString;
        } else {
            mPimpl->mImplementationComputeVariablesMethodFdmWoevString = implementationComputeVariablesMethodString;
        }
    } else {
        if (withExternalVariables) {
            mPimpl->mImplementationComputeVariablesMethodFamWevString = implementationComputeVariablesMethodString;
        } else {
            mPimpl->mImplementationComputeVariablesMethodFamWoevString = implementationComputeVariablesMethodString;
        }
    }
}